

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint kj::hashCode<capnp::_::RawBrandedSchema_const*const&,unsigned_char_const&>
               (RawBrandedSchema **values,uchar *values_1)

{
  uint uVar1;
  uint hashes [2];
  int local_18;
  uint local_14;
  ArrayPtr<unsigned_char> local_10;
  
  local_10.ptr = (uchar *)&local_18;
  local_18 = (int)((ulong)*values >> 0x20) * 0xbfe3 + (int)*values;
  local_14 = (uint)*values_1;
  local_10.size_ = 8;
  uVar1 = hashCode<kj::ArrayPtr<unsigned_char>>(&local_10);
  return uVar1;
}

Assistant:

inline uint hashCode(T&&... values) {
  uint hashes[] = { hashCode(kj::fwd<T>(values))... };
  return hashCode(kj::ArrayPtr<uint>(hashes).asBytes());
}